

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O0

void __thiscall dg::vr::StructureAnalyzer::initializeCallRelations(StructureAnalyzer *this)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  pointer ppVar4;
  VRLocation *pVVar5;
  Argument *pAVar6;
  map<const_llvm::Function_*,_std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>_>_>_>
  *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>_>_>,_bool>
  pVar7;
  Value *realArg;
  Argument *formalArg;
  Argument *__end4;
  Argument *__begin4;
  iterator_range<const_llvm::Argument_*> *__range4;
  uint argCount;
  CallRelation *callRelation;
  vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_> *callRelations;
  CallInst *call;
  Value *user;
  user_iterator_impl<const_llvm::User> __end3;
  user_iterator_impl<const_llvm::User> __begin3;
  iterator_range<llvm::Value::user_iterator_impl<const_llvm::User>_> *__range3;
  pair<std::_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>_>_>,_bool>
  pair;
  Function *function;
  const_iterator __end2;
  const_iterator __begin2;
  Module *__range2;
  undefined4 in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffeec;
  VRCodeGraph *in_stack_fffffffffffffef0;
  Function **__args;
  Argument *local_d8;
  iterator_range<const_llvm::Argument_*> local_d0;
  iterator_range<const_llvm::Argument_*> *local_c0;
  uint local_b4;
  reference local_b0;
  vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_> *local_a8;
  ret_type local_a0;
  User *local_98;
  use_iterator_impl<llvm::Use> local_90;
  use_iterator_impl<llvm::Use> local_88;
  iterator_range<llvm::Value::user_iterator_impl<const_llvm::User>_> local_80;
  iterator_range<llvm::Value::user_iterator_impl<const_llvm::User>_> *local_70;
  _Base_ptr local_68;
  undefined1 local_60;
  Function *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  reference local_40;
  _Base_ptr local_38;
  undefined1 local_30;
  reference local_28;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_20;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_18;
  undefined8 local_10;
  
  local_10 = *(undefined8 *)in_RDI;
  local_18.NodePtr =
       (node_pointer)
       llvm::Module::begin((Module *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  local_20.NodePtr =
       (node_pointer)
       llvm::Module::end((Module *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  while (bVar1 = llvm::operator!=(&local_18,&local_20), bVar1) {
    local_28 = llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
               ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                            *)0x1f0a6c);
    uVar3 = llvm::GlobalValue::isDeclaration();
    if ((uVar3 & 1) == 0) {
      in_stack_fffffffffffffef0 = (VRCodeGraph *)(in_RDI + 0xd0);
      local_40 = local_28;
      local_58 = (Function *)0x0;
      uStack_50 = 0;
      local_48 = 0;
      __args = &local_58;
      std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>::vector
                ((vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_> *)0x1f0ad5);
      pVar7 = std::
              map<llvm::Function_const*,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>,std::less<llvm::Function_const*>,std::allocator<std::pair<llvm::Function_const*const,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>>>
              ::
              emplace<llvm::Function_const*,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>
                        (in_RDI,__args,
                         (vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_> *)
                         in_stack_fffffffffffffef0);
      local_68 = (_Base_ptr)pVar7.first._M_node;
      local_60 = pVar7.second;
      local_38 = local_68;
      local_30 = local_60;
      std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>::~vector
                ((vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_> *)in_RDI);
      local_80 = llvm::Value::users((Value *)in_stack_fffffffffffffef0);
      local_70 = &local_80;
      local_88.U = (Use *)llvm::iterator_range<llvm::Value::user_iterator_impl<const_llvm::User>_>::
                          begin(local_70);
      local_90.U = (Use *)llvm::iterator_range<llvm::Value::user_iterator_impl<const_llvm::User>_>::
                          end(local_70);
      while (bVar1 = llvm::Value::user_iterator_impl<const_llvm::User>::operator!=
                               ((user_iterator_impl<const_llvm::User> *)in_stack_fffffffffffffef0,
                                (user_iterator_impl<const_llvm::User> *)
                                CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)),
            bVar1) {
        local_98 = llvm::Value::user_iterator_impl<const_llvm::User>::operator*
                             ((user_iterator_impl<const_llvm::User> *)0x1f0ba8);
        local_a0 = llvm::dyn_cast<llvm::CallInst,llvm::Value_const>
                             ((Value *)in_stack_fffffffffffffef0);
        if (local_a0 != (ret_type)0x0) {
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_llvm::Function_*const,_std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>_>_>
                                 *)0x1f0bdc);
          local_a8 = &ppVar4->second;
          std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>::emplace_back<>
                    ((vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_> *)
                     in_stack_fffffffffffffef0);
          local_b0 = std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>::back
                               ((vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>
                                 *)in_stack_fffffffffffffef0);
          pVVar5 = VRCodeGraph::getVRLocation
                             (in_stack_fffffffffffffef0,
                              (Instruction *)
                              CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          local_b0->callSite = pVVar5;
          local_b4 = 0;
          local_d0 = llvm::Function::args((Function *)in_stack_fffffffffffffef0);
          local_c0 = &local_d0;
          local_d8 = llvm::iterator_range<const_llvm::Argument_*>::begin(local_c0);
          pAVar6 = llvm::iterator_range<const_llvm::Argument_*>::end(local_c0);
          while ((local_d8 != pAVar6 &&
                 (in_stack_fffffffffffffeec = local_b4,
                 uVar2 = llvmutils::getNumArgOperands((CallInst *)0x1f0c8f),
                 in_stack_fffffffffffffeec < uVar2))) {
            llvm::CallBase::getArgOperand
                      ((CallBase *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
            std::
            vector<std::pair<llvm::Argument_const*,llvm::Value_const*>,std::allocator<std::pair<llvm::Argument_const*,llvm::Value_const*>>>
            ::emplace_back<llvm::Argument_const*,llvm::Value_const*&>
                      ((vector<std::pair<const_llvm::Argument_*,_const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Argument_*,_const_llvm::Value_*>_>_>
                        *)in_RDI,(Argument **)__args,(Value **)in_stack_fffffffffffffef0);
            local_b4 = local_b4 + 1;
            local_d8 = local_d8 + 0x28;
          }
        }
        llvm::Value::user_iterator_impl<const_llvm::User>::operator++
                  ((user_iterator_impl<const_llvm::User> *)in_stack_fffffffffffffef0);
      }
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                  *)in_stack_fffffffffffffef0);
  }
  return;
}

Assistant:

void StructureAnalyzer::initializeCallRelations() {
    for (const llvm::Function &function : module) {
        if (function.isDeclaration())
            continue;

        auto pair = callRelationsMap.emplace(&function,
                                             std::vector<CallRelation>());

        // for each location, where the function is called
        for (const llvm::Value *user : function.users()) {
            // get call from user
            const llvm::CallInst *call = llvm::dyn_cast<llvm::CallInst>(user);
            if (!call)
                continue;

            std::vector<CallRelation> &callRelations = pair.first->second;

            callRelations.emplace_back();
            CallRelation &callRelation = callRelations.back();

            // set pointer to the location from which the function is called
            callRelation.callSite = &codeGraph.getVRLocation(call);

            // set formal parameters equal to real
            unsigned argCount = 0;
            for (const llvm::Argument &formalArg : function.args()) {
                if (argCount >= llvmutils::getNumArgOperands(call))
                    break;
                const llvm::Value *realArg = call->getArgOperand(argCount);

                callRelation.equalPairs.emplace_back(&formalArg, realArg);
                ++argCount;
            }
        }
    }
}